

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O1

void amrex::average_down_nodal<amrex::FArrayBox>
               (FabArray<amrex::FArrayBox> *fine,FabArray<amrex::FArrayBox> *crse,IntVect *ratio,
               int ngcrse,bool mfiter_is_definitely_safe)

{
  DistributionMapping *this;
  uint nvar;
  int iVar1;
  int iVar2;
  ulong uVar3;
  FabArray<amrex::FArrayBox> *pFVar4;
  FabArray<amrex::FArrayBox> *pFVar5;
  bool bVar6;
  int iVar7;
  Periodicity *period;
  long lVar8;
  int iVar9;
  undefined8 *puVar10;
  long lVar11;
  undefined7 in_register_00000081;
  long lVar12;
  long lVar13;
  undefined8 *puVar14;
  long lVar15;
  long local_2d8;
  Box local_2cc;
  IntVect *local_2b0;
  FabArray<amrex::FArrayBox> *local_2a8;
  FabArray<amrex::FArrayBox> *local_2a0;
  ulong local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  ulong local_270;
  undefined1 local_268 [24];
  pointer pbStack_250;
  undefined8 local_248;
  int local_240;
  FabFactory<amrex::FArrayBox> local_220;
  BoxArray local_218;
  MFIter mfi;
  
  nvar = (crse->super_FabArrayBase).n_comp;
  if ((int)CONCAT71(in_register_00000081,mfiter_is_definitely_safe) == 0) {
    this = &(fine->super_FabArrayBase).distributionMap;
    bVar6 = DistributionMapping::operator==(this,&(crse->super_FabArrayBase).distributionMap);
    if ((!bVar6) ||
       ((fine->super_FabArrayBase).boxarray.m_ref.
        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (crse->super_FabArrayBase).boxarray.m_ref.
        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
      coarsen(&local_218,&(fine->super_FabArrayBase).boxarray,ratio);
      local_268._0_8_ = (double *)0x1;
      local_268._8_8_ = (Arena *)0x0;
      local_268._16_8_ = (pointer)0x0;
      pbStack_250 = (pointer)0x0;
      local_248 = (pointer)0x0;
      local_220._vptr_FabFactory = (_func_int **)&PTR__FabFactory_008378d0;
      local_2cc.smallend.vect[0] = ngcrse;
      local_2cc.smallend.vect[1] = ngcrse;
      local_2cc.smallend.vect[2] = ngcrse;
      FabArray<amrex::FArrayBox>::FabArray
                ((FabArray<amrex::FArrayBox> *)&mfi,&local_218,this,nvar,&local_2cc.smallend,
                 (MFInfo *)local_268,&local_220);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_268 + 0x10));
      BoxArray::~BoxArray(&local_218);
      average_down_nodal<amrex::FArrayBox>
                (fine,(FabArray<amrex::FArrayBox> *)&mfi,ratio,ngcrse,false);
      period = Periodicity::NonPeriodic();
      local_268._4_4_ = ngcrse;
      local_268._0_4_ = ngcrse;
      local_268._8_4_ = ngcrse;
      local_218.m_bat.m_bat_type = ngcrse;
      local_218.m_bat.m_op.m_indexType.m_typ.itype = (BATindexType)ngcrse;
      local_218.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)ngcrse;
      FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                (crse,(FabArray<amrex::FArrayBox> *)&mfi,0,0,nvar,(IntVect *)&local_218,
                 (IntVect *)local_268,period,COPY,(CPC *)0x0,false);
      FabArray<amrex::FArrayBox>::~FabArray((FabArray<amrex::FArrayBox> *)&mfi);
      return;
    }
  }
  local_2b0 = ratio;
  MFIter::MFIter(&mfi,&crse->super_FabArrayBase,true);
  pFVar4 = fine;
  pFVar5 = crse;
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      local_2a0 = pFVar5;
      local_2a8 = pFVar4;
      pFVar5 = local_2a0;
      pFVar4 = local_2a8;
      MFIter::growntilebox(&local_2cc,&mfi,ngcrse);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_218,pFVar5,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)local_268,pFVar4,&mfi);
      if (0 < (int)nvar) {
        iVar1 = local_2b0->vect[2];
        iVar2 = local_2b0->vect[0];
        local_270 = (ulong)(uint)local_2cc.bigend.vect[1];
        lVar12 = (long)local_2cc.smallend.vect[1];
        local_280 = (long)local_2cc.smallend.vect[0] * 8;
        local_288 = local_280 * iVar2;
        local_290 = lVar12 * local_2b0->vect[1];
        local_278 = (long)local_2b0->vect[1] * 8;
        local_2d8 = 0;
        uVar3 = 0;
        do {
          local_298 = uVar3;
          iVar9 = local_2cc.smallend.vect[2] * iVar1;
          iVar7 = local_2cc.smallend.vect[2];
          if (local_2cc.smallend.vect[2] <= local_2cc.bigend.vect[2]) {
            do {
              if (local_2cc.smallend.vect[1] <= local_2cc.bigend.vect[1]) {
                puVar14 = (undefined8 *)
                          (local_268._0_8_ +
                          (long)pbStack_250 * local_2d8 +
                          ((long)iVar9 - (long)local_240) * local_268._16_8_ * 8 +
                          (local_290 - local_248._4_4_) * local_268._8_8_ * 8 +
                          (long)(int)local_248 * -8 + local_288);
                lVar15 = CONCAT44(local_218.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0],
                                  local_218.m_bat.m_op.m_bndryReg.m_typ.itype) * 8;
                lVar8 = local_218.m_bat.m_op._20_8_ * local_2d8 +
                        (lVar12 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) * lVar15 +
                        ((long)iVar7 - (long)local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                        local_218.m_bat.m_op._12_8_ * 8 +
                        (long)local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2] * -8 +
                        CONCAT44(local_218.m_bat.m_op.m_indexType.m_typ.itype,
                                 local_218.m_bat.m_bat_type) + local_280;
                lVar13 = lVar12;
                do {
                  if (local_2cc.smallend.vect[0] <= local_2cc.bigend.vect[0]) {
                    lVar11 = 0;
                    puVar10 = puVar14;
                    do {
                      *(undefined8 *)(lVar8 + lVar11 * 8) = *puVar10;
                      puVar10 = puVar10 + iVar2;
                      lVar11 = lVar11 + 1;
                    } while ((local_2cc.bigend.vect[0] - local_2cc.smallend.vect[0]) + 1 !=
                             (int)lVar11);
                  }
                  lVar13 = lVar13 + 1;
                  puVar14 = (undefined8 *)((long)puVar14 + local_268._8_8_ * local_278);
                  lVar8 = lVar8 + lVar15;
                } while (local_2cc.bigend.vect[1] + 1U != (int)lVar13);
              }
              iVar9 = iVar9 + iVar1;
              bVar6 = iVar7 != local_2cc.bigend.vect[2];
              iVar7 = iVar7 + 1;
            } while (bVar6);
          }
          local_2d8 = local_2d8 + 8;
          uVar3 = local_298 + 1;
        } while (local_298 + 1 != (ulong)nvar);
      }
      MFIter::operator++(&mfi);
      pFVar4 = local_2a8;
      pFVar5 = local_2a0;
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void average_down_nodal (const FabArray<FAB>& fine, FabArray<FAB>& crse,
                         const IntVect& ratio, int ngcrse, bool mfiter_is_definitely_safe)
{
    AMREX_ASSERT(fine.is_nodal());
    AMREX_ASSERT(crse.is_nodal());
    AMREX_ASSERT(crse.nComp() == fine.nComp());

    int ncomp = crse.nComp();
    using value_type = typename FAB::value_type;

    if (mfiter_is_definitely_safe || isMFIterSafe(fine, crse))
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(ngcrse);
            Array4<value_type> const& crsearr = crse.array(mfi);
            Array4<value_type const> const& finearr = fine.const_array(mfi);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                amrex_avgdown_nodes(tbx,crsearr,finearr,0,0,ncomp,ratio);
            });
        }
    }
    else
    {
        FabArray<FAB> ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                           ncomp, ngcrse);
        average_down_nodal(fine, ctmp, ratio, ngcrse);
        crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
    }
}